

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

int set_contains(set s,set_key key)

{
  hash hVar1;
  pair ppVar2;
  
  if (key != (set_key)0x0 && s != (set)0x0) {
    hVar1 = (*s->hash_cb)(key);
    ppVar2 = bucket_get_pair(s->buckets + hVar1 % s->capacity,s->compare_cb,key);
    if (ppVar2 != (pair)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int set_contains(set s, set_key key)
{
	if (s != NULL && key != NULL)
	{
		set_hash hash = s->hash_cb(key);

		size_t index = hash % s->capacity;

		bucket b = &s->buckets[index];

		pair p = bucket_get_pair(b, s->compare_cb, key);

		if (p != NULL)
		{
			return 0;
		}
	}

	return 1;
}